

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O3

void __thiscall Handler::IncreasePurchaseNumber(Handler *this)

{
  pointer pRVar1;
  pointer pEVar2;
  pointer pEVar3;
  uint16_t uVar4;
  
  pRVar1 = (this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar3 = *(pointer *)
            &pRVar1[this->today].extendResult.
             super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl;
  pEVar2 = *(pointer *)
            ((long)&pRVar1[this->today].extendResult.
                    super__Vector_base<ExtendResult,_std::allocator<ExtendResult>_>._M_impl + 8);
  if (pEVar3 != pEVar2) {
    uVar4 = this->totalPurchasedServerNum;
    do {
      uVar4 = uVar4 + pEVar3->purchaseNum;
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
    this->totalPurchasedServerNum = uVar4;
  }
  return;
}

Assistant:

void Handler::IncreasePurchaseNumber() {
    std::vector<ExtendResult> &extendResult = result[today].extendResult;
    for (ExtendResult &res : extendResult) {
        totalPurchasedServerNum += res.purchaseNum;
    }
}